

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas.c
# Opt level: O3

doublereal Wnrm2_(integer *n,doublereal *x,integer *incx)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  lVar5 = (long)*n;
  iVar2 = *incx;
  lVar6 = (long)iVar2;
  bVar3 = 0 < lVar5;
  if (lVar6 < 0) {
    bVar3 = lVar5 < 2;
  }
  if (bVar3) {
    dVar10 = 0.0;
    lVar7 = 0;
    do {
      lVar1 = lVar6 + 1 + lVar7;
      dVar9 = x[lVar7];
      uVar8 = -(ulong)(-dVar9 <= dVar9);
      dVar9 = (double)(~uVar8 & (ulong)-dVar9 | (ulong)dVar9 & uVar8);
      uVar8 = -(ulong)(dVar9 <= dVar10);
      bVar4 = lVar1 <= lVar5;
      if (iVar2 < 0) {
        bVar4 = lVar5 <= lVar1;
      }
      dVar10 = (double)(uVar8 & (ulong)dVar10 | ~uVar8 & (ulong)dVar9);
      lVar7 = lVar7 + lVar6;
    } while (bVar4);
    dVar9 = 0.0;
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      if (bVar3) {
        lVar7 = 0;
        do {
          lVar1 = lVar6 + 1 + lVar7;
          dVar9 = dVar9 + (x[lVar7] / dVar10) * (x[lVar7] / dVar10);
          bVar3 = lVar1 <= lVar5;
          if (iVar2 < 0) {
            bVar3 = lVar5 <= lVar1;
          }
          lVar7 = lVar7 + lVar6;
        } while (bVar3);
      }
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      return dVar10 * dVar9;
    }
  }
  return 0.0;
}

Assistant:

doublereal dnrm2_(integer *n, doublereal *x, integer *incx)
{
    /* System generated locals */
    integer i__1, i__2;
    doublereal ret_val, d__1, d__2, d__3;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    static integer i__;
    static doublereal scale;

/*     ********** */

/*     Function dnrm2 */

/*     Given a vector x of length n, this function calculates the */
/*     Euclidean norm of x with stride incx. */

/*     The function statement is */

/*       double precision function dnrm2(n,x,incx) */

/*     where */

/*       n is a positive integer input variable. */

/*       x is an input array of length n. */

/*       incx is a positive integer variable that specifies the */
/*         stride of the vector. */

/*     Subprograms called */

/*       FORTRAN-supplied ... abs, max, sqrt */

/*     MINPACK-2 Project. February 1991. */
/*     Argonne National Laboratory. */
/*     Brett M. Averick. */

/*     ********** */
    /* Parameter adjustments */
    --x;

    /* Function Body */
    ret_val = 0.;
    scale = 0.;
    i__1 = *n;
    i__2 = *incx;
    for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
/* Computing MAX */
	d__2 = scale, d__3 = (d__1 = x[i__], abs(d__1));
	scale = max(d__2,d__3);
/* L10: */
    }
    if (scale == 0.) {
	return ret_val;
    }
    i__2 = *n;
    i__1 = *incx;
    for (i__ = 1; i__1 < 0 ? i__ >= i__2 : i__ <= i__2; i__ += i__1) {
/* Computing 2nd power */
	d__1 = x[i__] / scale;
	ret_val += d__1 * d__1;
/* L20: */
    }
    ret_val = scale * sqrt(ret_val);
    return ret_val;
}